

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::
async_call<void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>,libtorrent::peer_class_info_const&),libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&,libtorrent::peer_class_info_const&>
          (session_handle *this,offset_in_session_impl_to_subr f,
          strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> *a,peer_class_info *a_1)

{
  io_context *ctx;
  peer_class_info *in_R8;
  shared_ptr<libtorrent::aux::session_impl> s;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_90 [32];
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_70;
  peer_class_info local_68;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,this);
  if (local_a0._M_ptr != (element_type *)0x0) {
    ctx = (local_a0._M_ptr)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)local_90,
               &local_a0);
    local_70.m_val = *(uint *)a_1;
    local_90._16_8_ = f;
    local_90._24_8_ = a;
    peer_class_info::peer_class_info(&local_68,in_R8);
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::session_handle::async_call<void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>,libtorrent::peer_class_info_const&),libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&,libtorrent::peer_class_info_const&>(void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>,libtorrent::peer_class_info_const&),libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&,libtorrent::peer_class_info_const&)const::_lambda()_1_>
              (ctx,(type_conflict17 *)local_90,(type *)0x0);
    const::{lambda()#1}::~async_call((_lambda___1_ *)local_90);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    return;
  }
  local_90._0_4_ = invalid_session_handle;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_90);
}

Assistant:

void session_handle::async_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);
		dispatch(s->get_context(), [=]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				s->alerts().emplace_alert<session_error_alert>(e.code(), e.what());
			} catch (std::exception const& e) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), e.what());
			} catch (...) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), "unknown error");
			}
#endif
		});
	}